

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O0

bool __thiscall SW2048Game::copyToLast(SW2048Game *this)

{
  int local_1c;
  int local_18;
  int x;
  int y;
  bool result;
  SW2048Game *this_local;
  
  x._3_1_ = false;
  for (local_18 = 0; local_18 < this->order; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < this->order; local_1c = local_1c + 1) {
      if (this->last[local_18][local_1c] != this->board[local_18][local_1c]) {
        this->last[local_18][local_1c] = this->board[local_18][local_1c];
        x._3_1_ = true;
      }
    }
  }
  return x._3_1_;
}

Assistant:

bool SW2048Game::copyToLast() {
	bool result = false;
	for(int y = 0; y<order; y++)
		for (int x = 0; x < order; x++) {
			if (last[y][x] != board[y][x]) {
				last[y][x] = board[y][x];
				result = true;
			}
		}
	return result;
}